

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type * __thiscall
FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>_>_>,_Fad<Fad<double>_>_>
::fastAccessDx(value_type *__return_storage_ptr__,
              FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>_>_>,_Fad<Fad<double>_>_>
              *this,int i)

{
  uint uVar1;
  Fad<double> *pFVar2;
  uint uVar3;
  double *pdVar4;
  double *pdVar5;
  ulong uVar6;
  double *pdVar7;
  double *pdVar8;
  value_type local_50;
  
  FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>_>
  ::fastAccessDx(&local_50,&this->left_->fadexpr_,i);
  pFVar2 = (this->right_->dx_).ptr_to_data;
  __return_storage_ptr__->val_ = local_50.val_ + pFVar2[i].val_;
  uVar1 = pFVar2[i].dx_.num_elts;
  uVar3 = uVar1;
  if ((int)uVar1 < local_50.dx_.num_elts) {
    uVar3 = local_50.dx_.num_elts;
  }
  (__return_storage_ptr__->dx_).num_elts = 0;
  (__return_storage_ptr__->dx_).ptr_to_data = (double *)0x0;
  if ((int)uVar3 < 1) {
    __return_storage_ptr__->defaultVal = 0.0;
  }
  else {
    (__return_storage_ptr__->dx_).num_elts = uVar3;
    pdVar4 = (double *)operator_new__((ulong)uVar3 * 8);
    (__return_storage_ptr__->dx_).ptr_to_data = pdVar4;
    __return_storage_ptr__->defaultVal = 0.0;
    pdVar5 = pFVar2[i].dx_.ptr_to_data;
    uVar6 = 0;
    do {
      pdVar7 = local_50.dx_.ptr_to_data;
      if (local_50.dx_.num_elts == 0) {
        pdVar7 = &local_50.defaultVal;
      }
      pdVar8 = pdVar5;
      if (uVar1 == 0) {
        pdVar8 = &pFVar2[i].defaultVal;
      }
      pdVar4[uVar6] = *pdVar7 + *pdVar8;
      uVar6 = uVar6 + 1;
      pdVar5 = pdVar5 + 1;
      local_50.dx_.ptr_to_data = local_50.dx_.ptr_to_data + 1;
    } while (uVar3 != uVar6);
  }
  Fad<double>::~Fad(&local_50);
  return __return_storage_ptr__;
}

Assistant:

value_type fastAccessDx(int i) const { return left_.fastAccessDx(i)+right_.fastAccessDx(i);}